

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O2

void bonk_free(t_bonk *x)

{
  int *piVar1;
  int iVar2;
  t_filterbank *fatso;
  t_filterkernel *fatso_00;
  void *fatso_01;
  t_filterbank *ptVar3;
  t_filterbank *ptVar4;
  t_filterbank **pptVar5;
  int iVar6;
  long lVar7;
  t_float **pptVar8;
  long lVar9;
  bool bVar10;
  
  iVar2 = x->x_ninsig;
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  pptVar8 = &x->x_insig->g_inbuf;
  while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
    freebytes(*pptVar8,(long)x->x_npoints << 2);
    pptVar8 = pptVar8 + 0x4b3;
  }
  freebytes(x->x_insig,(long)iVar2 * 0x2598);
  clock_free(x->x_clock);
  fatso = x->x_filterbank;
  piVar1 = &fatso->b_refcount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    ptVar4 = bonk_filterbanklist;
    if (bonk_filterbanklist == fatso) {
      pptVar5 = &bonk_filterbanklist;
      ptVar4 = fatso;
    }
    else {
      do {
        ptVar3 = ptVar4;
        ptVar4 = ptVar3->b_next;
        if (ptVar4 == (t_filterbank *)0x0) goto LAB_0019aac6;
      } while (ptVar4 != fatso);
      pptVar5 = &ptVar3->b_next;
    }
    *pptVar5 = ptVar4->b_next;
LAB_0019aac6:
    lVar9 = 0;
    lVar7 = 0;
    while( true ) {
      fatso_00 = fatso->b_vec;
      if (fatso->b_nfilters <= lVar7) break;
      fatso_01 = *(void **)((long)&fatso_00->k_stuff + lVar9);
      if (fatso_01 != (void *)0x0) {
        freebytes(fatso_01,(long)*(int *)((long)&fatso_00->k_filterpoints + lVar9) << 2);
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x20;
    }
    freebytes(fatso_00,(long)fatso->b_nfilters << 5);
    freebytes(fatso,0x30);
  }
  freebytes(x->x_template,(long)x->x_ntemplate * 800);
  return;
}

Assistant:

static void bonk_free(t_bonk *x)
{
    
    int i, ninsig = x->x_ninsig;
    t_insig *gp = x->x_insig;
#ifdef MSP
    dsp_free((t_pxobject *)x);
#endif
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        freebytes(gp->g_inbuf, x->x_npoints * sizeof(t_float));
    freebytes(x->x_insig, ninsig * sizeof(*x->x_insig));
    clock_free(x->x_clock);
    if (!--(x->x_filterbank->b_refcount))
        bonk_freefilterbank(x->x_filterbank);
    freebytes(x->x_template, x->x_ntemplate * sizeof(x->x_template[0]));
}